

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

char fsnav_schedule_plugin(_func_void *newplugin,int cycle,int shift)

{
  fsnav_plugin *pfVar1;
  size_t sVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  cVar3 = fsnav_add_plugin(newplugin);
  cVar6 = '\0';
  iVar9 = 0;
  if (cVar3 != '\0') {
    iVar4 = -cycle;
    if (0 < cycle) {
      iVar4 = cycle;
    }
    if (cycle != 0) {
      iVar7 = -cycle;
      if (0 < cycle) {
        iVar7 = cycle;
      }
      iVar9 = shift + iVar7;
      iVar8 = -iVar9;
      do {
        iVar9 = iVar9 - iVar7;
        iVar8 = iVar8 + iVar7;
      } while (iVar4 <= iVar9);
      iVar4 = -cycle;
      if (0 < cycle) {
        iVar4 = cycle;
      }
      iVar5 = 0;
      if (0 < iVar9) {
        iVar5 = iVar9;
      }
      iVar9 = iVar7 * (((iVar5 - (uint)(iVar5 != iVar9)) + iVar8) / (iVar4 + (uint)(iVar4 == 0)) +
                      (uint)(iVar5 != iVar9)) + iVar9;
    }
    pfVar1 = (fsnav->core).plugins;
    sVar2 = (fsnav->core).plugin_count;
    pfVar1[sVar2 - 1].cycle = cycle;
    pfVar1[sVar2 - 1].shift = iVar9;
    pfVar1[sVar2 - 1].tick = 0;
    cVar6 = '\x01';
  }
  return cVar6;
}

Assistant:

char fsnav_schedule_plugin(void(*newplugin)(void), int cycle, int shift)
{
	int abs_cycle;

	// add to the execution list
	if (!fsnav_add_plugin(newplugin))
		return 0;
	// shrink shift to [0..cycle-1]
	abs_cycle = abs(cycle);
	if (abs_cycle) {
		while (shift >= abs_cycle)
			shift -= abs_cycle;
		while (shift < 0)
			shift += abs_cycle;
	}
	else
		shift = 0;
	// set scheduling parameters
	fsnav->core.plugins[fsnav->core.plugin_count-1].cycle = cycle;
	fsnav->core.plugins[fsnav->core.plugin_count-1].shift = shift;
	fsnav->core.plugins[fsnav->core.plugin_count-1].tick  = 0;

	return 1;
}